

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm2d.c
# Opt level: O3

void av1_inv_txfm2d_add_64x16_c(int32_t *input,uint16_t *output,int stride,TX_TYPE tx_type,int bd)

{
  int32_t mod_input [1024];
  int txfm_buf [1152];
  int32_t local_2260 [512];
  undefined1 local_1a60 [2048];
  int32_t local_1260 [1164];
  
  memcpy(local_2260,input,0x800);
  memset(local_1a60,0,0x800);
  inv_txfm2d_add_facade(local_2260,output,stride,local_1260,tx_type,'\x12',bd);
  return;
}

Assistant:

void av1_inv_txfm2d_add_64x16_c(const int32_t *input, uint16_t *output,
                                int stride, TX_TYPE tx_type, int bd) {
  // Remap 32x16 input into a modified 64x16 by:
  // - Copying over these values in top-left 32x16 locations.
  // - Setting the rest of the locations to 0.
  int32_t mod_input[16 * 64];
  memcpy(mod_input, input, 16 * 32 * sizeof(*mod_input));
  memset(mod_input + 16 * 32, 0, 16 * 32 * sizeof(*mod_input));
  DECLARE_ALIGNED(32, int, txfm_buf[16 * 64 + 64 + 64]);
  inv_txfm2d_add_facade(mod_input, output, stride, txfm_buf, tx_type, TX_64X16,
                        bd);
}